

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  cmMakefile *this_00;
  bool bVar6;
  int iVar7;
  string *psVar8;
  _Base_ptr p_Var9;
  cmState *this_01;
  cmValue cVar10;
  long lVar11;
  cmExtraEclipseCDT4Generator *this_02;
  char *__end;
  char *pcVar12;
  char *__end_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *content;
  pointer puVar13;
  string_view arg;
  string sourceLinkedResourceName;
  cmXMLWriter xml;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraNatures;
  string compilerId;
  string filename;
  ostringstream environment;
  ostringstream errorOutputParser;
  cmGeneratedFileStream fout;
  string local_6a0;
  cmXMLWriter local_680;
  undefined1 local_628 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  long *local_5e8;
  long local_5e0;
  long local_5d8 [2];
  string *local_5c8;
  cmExtraEclipseCDT4Generator *local_5c0;
  pointer local_5b8;
  cmMakefile *local_5b0;
  string local_5a8;
  undefined1 local_588 [112];
  ios_base local_518 [264];
  undefined1 local_410 [112];
  ios_base local_3a0 [264];
  undefined1 local_298 [616];
  
  puVar13 = (((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_5b0 = *(cmMakefile **)
               ((long)(puVar13->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t + 0x70);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  pcVar2 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a8,pcVar2,pcVar2 + (this->HomeOutputDirectory)._M_string_length);
  std::__cxx11::string::append((char *)&local_5a8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_5a8,false,None);
  if (((byte)(*(_func_int **)(local_298._0_8_ + -0x18))[(long)(local_298 + 0x20)] & 5) != 0)
  goto LAB_003a6a75;
  pcVar2 = local_588 + 0x10;
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"CMAKE_C_COMPILER_ID","");
  this_00 = local_5b0;
  psVar8 = cmMakefile::GetSafeDefinition(local_5b0,(string *)local_588);
  local_5e8 = local_5d8;
  pcVar3 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e8,pcVar3,pcVar3 + psVar8->_M_string_length);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  if (local_5e0 == 0) {
    local_588._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"CMAKE_CXX_COMPILER_ID","");
    cmMakefile::GetSafeDefinition(this_00,(string *)local_588);
    std::__cxx11::string::_M_assign((string *)&local_5e8);
    if ((pointer)local_588._0_8_ != pcVar2) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
  }
  cmXMLWriter::cmXMLWriter(&local_680,(ostream *)local_298,0);
  cmXMLWriter::StartDocument(&local_680,"UTF-8");
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"projectDescription","");
  cmXMLWriter::StartElement(&local_680,(string *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"name","");
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_6a0,
             (cmLocalGenerator *)
             (puVar13->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
  local_628._0_8_ = local_628 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"CMAKE_BUILD_TYPE","");
  psVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)local_628);
  local_5c8 = &this->HomeOutputDirectory;
  GetPathBasename((string *)&local_608,local_5c8);
  GenerateProjectName((string *)local_410,&local_6a0,psVar8,(string *)&local_608);
  cmXMLWriter::StartElement(&local_680,(string *)local_588);
  cmXMLWriter::Content<std::__cxx11::string>
            (&local_680,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  cmXMLWriter::EndElement(&local_680);
  pcVar3 = local_410 + 0x10;
  if ((pointer)local_410._0_8_ != pcVar3) {
    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_allocated_capacity != &local_5f8) {
    operator_delete((void *)local_608._M_allocated_capacity,local_5f8._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_628 + 0x10)) {
    operator_delete((void *)local_628._0_8_,local_628._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"comment","");
  cmXMLWriter::StartElement(&local_680,(string *)local_588);
  cmXMLWriter::Content<char[1]>(&local_680,(char (*) [1])0x71dc05);
  cmXMLWriter::EndElement(&local_680);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"projects","");
  cmXMLWriter::StartElement(&local_680,(string *)local_588);
  cmXMLWriter::Content<char[1]>(&local_680,(char (*) [1])0x71dc05);
  cmXMLWriter::EndElement(&local_680);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"buildSpec","");
  cmXMLWriter::StartElement(&local_680,(string *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"buildCommand","");
  cmXMLWriter::StartElement(&local_680,(string *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"name","");
  cmXMLWriter::StartElement(&local_680,(string *)local_588);
  cmXMLWriter::Content<char[38]>(&local_680,(char (*) [38])"org.eclipse.cdt.make.core.makeBuilder");
  cmXMLWriter::EndElement(&local_680);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"triggers","");
  cmXMLWriter::StartElement(&local_680,(string *)local_588);
  cmXMLWriter::Content<char[24]>(&local_680,(char (*) [24])"clean,full,incremental,");
  cmXMLWriter::EndElement(&local_680);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"arguments","");
  cmXMLWriter::StartElement(&local_680,(string *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  AppendDictionary<char[6]>
            (&local_680,"org.eclipse.cdt.make.core.cleanBuildTarget",(char (*) [6])0x6ef96a);
  AppendDictionary<char[5]>
            (&local_680,"org.eclipse.cdt.make.core.enableCleanBuild",(char (*) [5])0x7074d7);
  AppendDictionary<char[5]>
            (&local_680,"org.eclipse.cdt.make.core.append_environment",(char (*) [5])0x7074d7);
  AppendDictionary<char[5]>
            (&local_680,"org.eclipse.cdt.make.core.stopOnError",(char (*) [5])0x7074d7);
  AppendDictionary<char[5]>
            (&local_680,"org.eclipse.cdt.make.core.enabledIncrementalBuild",(char (*) [5])0x7074d7);
  local_410._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_MAKE_PROGRAM","");
  psVar8 = cmMakefile::GetRequiredDefinition(this_00,(string *)local_410);
  pcVar4 = (psVar8->_M_dataplus)._M_p;
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_588,pcVar4,pcVar4 + psVar8->_M_string_length);
  AppendDictionary<std::__cxx11::string>
            (&local_680,"org.eclipse.cdt.make.core.build.command",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  if ((pointer)local_410._0_8_ != pcVar3) {
    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
  }
  AppendDictionary<char[47]>
            (&local_680,"org.eclipse.cdt.make.core.contents",
             (char (*) [47])"org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary<char[4]>
            (&local_680,"org.eclipse.cdt.make.core.build.target.inc",(char (*) [4])0x6d5b5c);
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_588,"CMAKE_ECLIPSE_MAKE_ARGUMENTS","");
  psVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)local_588);
  AppendDictionary<std::__cxx11::string>
            (&local_680,"org.eclipse.cdt.make.core.build.arguments",psVar8);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  pcVar4 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  local_588._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_588,pcVar4,pcVar4 + (this->HomeOutputDirectory)._M_string_length);
  AppendDictionary<std::__cxx11::string>
            (&local_680,"org.eclipse.cdt.make.core.buildLocation",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  AppendDictionary<char[6]>
            (&local_680,"org.eclipse.cdt.make.core.useDefaultBuildCmd",(char (*) [6])0x6fd197);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_588,"VERBOSE=1|CMAKE_NO_VERBOSE=1|",0x1d);
  iVar7 = std::__cxx11::string::compare((char *)&local_5e8);
  if (iVar7 == 0) {
    AddEnvVar((ostream *)local_588,"PATH",
              (cmLocalGenerator *)
              (puVar13->_M_t).
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
    AddEnvVar((ostream *)local_588,"INCLUDE",
              (cmLocalGenerator *)
              (puVar13->_M_t).
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
    AddEnvVar((ostream *)local_588,"LIB",
              (cmLocalGenerator *)
              (puVar13->_M_t).
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
    pcVar12 = "LIBPATH";
LAB_003a61e6:
    AddEnvVar((ostream *)local_588,pcVar12,
              (cmLocalGenerator *)
              (puVar13->_M_t).
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)&local_5e8);
    if (iVar7 == 0) {
      pcVar12 = "INTEL_LICENSE_FILE";
      goto LAB_003a61e6;
    }
  }
  std::__cxx11::stringbuf::str();
  AppendDictionary<std::__cxx11::string>
            (&local_680,"org.eclipse.cdt.make.core.environment",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  if ((pointer)local_410._0_8_ != pcVar3) {
    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
  }
  AppendDictionary<char[5]>
            (&local_680,"org.eclipse.cdt.make.core.enableFullBuild",(char (*) [5])0x7074d7);
  AppendDictionary<char[4]>
            (&local_680,"org.eclipse.cdt.make.core.build.target.auto",(char (*) [4])0x6d5b5c);
  AppendDictionary<char[6]>
            (&local_680,"org.eclipse.cdt.make.core.enableAutoBuild",(char (*) [6])0x6fd197);
  AppendDictionary<char[6]>
            (&local_680,"org.eclipse.cdt.make.core.build.target.clean",(char (*) [6])0x6ef96a);
  AppendDictionary<char[4]>
            (&local_680,"org.eclipse.cdt.make.core.fullBuildTarget",(char (*) [4])0x6d5b5c);
  AppendDictionary<char[1]>
            (&local_680,"org.eclipse.cdt.make.core.buildArguments",(char (*) [1])0x71dc05);
  pcVar2 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  local_410._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_410,pcVar2,pcVar2 + (this->HomeOutputDirectory)._M_string_length);
  AppendDictionary<std::__cxx11::string>
            (&local_680,"org.eclipse.cdt.make.core.build.location",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  if ((pointer)local_410._0_8_ != pcVar3) {
    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
  }
  AppendDictionary<char[4]>
            (&local_680,"org.eclipse.cdt.make.core.autoBuildTarget",(char (*) [4])0x6d5b5c);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
  iVar7 = std::__cxx11::string::compare((char *)&local_5e8);
  if (iVar7 == 0) {
    lVar11 = 0x23;
    pcVar12 = "org.eclipse.cdt.core.VCErrorParser;";
LAB_003a6398:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_410,pcVar12,lVar11);
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)&local_5e8);
    if (iVar7 == 0) {
      lVar11 = 0x24;
      pcVar12 = "org.eclipse.cdt.core.ICCErrorParser;";
      goto LAB_003a6398;
    }
  }
  pcVar12 = "org.eclipse.cdt.core.MakeErrorParser;";
  if ((ulong)this->SupportsGmakeErrorParser != 0) {
    pcVar12 = "org.eclipse.cdt.core.GmakeErrorParser;";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_410,pcVar12,(ulong)this->SupportsGmakeErrorParser + 0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_410,
             "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;"
             ,0x6c);
  std::__cxx11::stringbuf::str();
  AppendDictionary<std::__cxx11::string>
            (&local_680,"org.eclipse.cdt.core.errorOutputParser",&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(&local_680);
  cmXMLWriter::EndElement(&local_680);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"buildCommand","");
  cmXMLWriter::StartElement(&local_680,&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"name","");
  cmXMLWriter::StartElement(&local_680,&local_6a0);
  cmXMLWriter::Content<char[47]>
            (&local_680,(char (*) [47])"org.eclipse.cdt.make.core.ScannerConfigBuilder");
  cmXMLWriter::EndElement(&local_680);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"arguments","");
  cmXMLWriter::StartElement(&local_680,&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(&local_680);
  cmXMLWriter::EndElement(&local_680);
  cmXMLWriter::EndElement(&local_680);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"natures","");
  cmXMLWriter::StartElement(&local_680,&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"nature","");
  cmXMLWriter::StartElement(&local_680,&local_6a0);
  cmXMLWriter::Content<char[37]>(&local_680,(char (*) [37])"org.eclipse.cdt.make.core.makeNature");
  cmXMLWriter::EndElement(&local_680);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"nature","");
  local_5b8 = puVar13;
  cmXMLWriter::StartElement(&local_680,&local_6a0);
  cmXMLWriter::Content<char[46]>
            (&local_680,(char (*) [46])"org.eclipse.cdt.make.core.ScannerConfigNature");
  cmXMLWriter::EndElement(&local_680);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  p_Var9 = (this->Natures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Natures)._M_t._M_impl.super__Rb_tree_header;
  local_5c0 = this;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"nature","");
      cmXMLWriter::StartElement(&local_680,&local_6a0);
      cmXMLWriter::Content<std::__cxx11::string>
                (&local_680,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1));
      cmXMLWriter::EndElement(&local_680);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  this_01 = cmMakefile::GetState(local_5b0);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"ECLIPSE_EXTRA_NATURES","");
  puVar13 = local_5b8;
  cVar10 = cmState::GetGlobalProperty(this_01,&local_6a0);
  this_02 = local_5c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if (cVar10.Value != (string *)0x0) {
    arg._M_str = ((cVar10.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar10.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_628,arg,false);
    uVar5 = local_628._8_8_;
    if (local_628._0_8_ != local_628._8_8_) {
      content = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628._0_8_
      ;
      do {
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"nature","");
        cmXMLWriter::StartElement(&local_680,&local_6a0);
        cmXMLWriter::Content<std::__cxx11::string>(&local_680,content);
        cmXMLWriter::EndElement(&local_680);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
        }
        content = content + 1;
      } while (content != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5
              );
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_628);
    this_02 = local_5c0;
    puVar13 = local_5b8;
  }
  cmXMLWriter::EndElement(&local_680);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"linkedResources","");
  cmXMLWriter::StartElement(&local_680,&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if (this_02->IsOutOfSourceBuild == true) {
    local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"[Source directory]","");
    psVar8 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_
                       ((cmLocalGenerator *)
                        (puVar13->_M_t).
                        super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                        ._M_t);
    local_628._0_8_ = local_628 + 0x10;
    pcVar2 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_628,pcVar2,pcVar2 + psVar8->_M_string_length);
    bVar6 = cmsys::SystemTools::IsSubDirectory(local_5c8,(string *)local_628);
    if (!bVar6) {
      local_608._M_allocated_capacity = (size_type)&local_5f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_608,local_628._0_8_,
                 (pointer)(local_628._0_8_ + (long)(_Alloc_hider *)local_628._8_8_));
      AppendLinkedResource(&local_680,&local_6a0,(string *)&local_608,LinkToFolder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_allocated_capacity != &local_5f8) {
        operator_delete((void *)local_608._M_allocated_capacity,local_5f8._M_allocated_capacity + 1)
        ;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this_02->SrcLinkedResources,&local_6a0);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_628 + 0x10)) {
      operator_delete((void *)local_628._0_8_,local_628._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
  }
  if (this_02->SupportsVirtualFolders == true) {
    CreateLinksToSubprojects(this_02,&local_680,local_5c8);
    CreateLinksForTargets(this_02,&local_680);
  }
  cmXMLWriter::EndElement(&local_680);
  cmXMLWriter::EndElement(&local_680);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
  std::ios_base::~ios_base(local_3a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
  std::ios_base::~ios_base(local_518);
  cmXMLWriter::~cmXMLWriter(&local_680);
  if (local_5e8 != local_5d8) {
    operator_delete(local_5e8,local_5d8[0] + 1);
  }
LAB_003a6a75:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty()) // no C compiler, try the C++ compiler:
  {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
  }

  cmXMLWriter xml(fout);

  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");

  xml.Element("name",
              cmExtraEclipseCDT4Generator::GenerateProjectName(
                lg->GetProjectName(),
                mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                cmExtraEclipseCDT4Generator::GetPathBasename(
                  this->HomeOutputDirectory)));

  xml.Element("comment", "");
  xml.Element("projects", "");

  xml.StartElement("buildSpec");
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.makeBuilder");
  xml.Element("triggers", "clean,full,incremental,");
  xml.StartElement("arguments");

  // use clean target
  AppendDictionary(xml, "org.eclipse.cdt.make.core.cleanBuildTarget", "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableCleanBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.append_environment",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.stopOnError", "true");

  // set the make command
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enabledIncrementalBuild",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.command",
                   cmExtraEclipseCDT4Generator::GetEclipsePath(
                     mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.contents",
                   "org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.inc", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.arguments",
                   mf->GetSafeDefinition("CMAKE_ECLIPSE_MAKE_ARGUMENTS"));
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.buildLocation",
    cmExtraEclipseCDT4Generator::GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.useDefaultBuildCmd",
                   "false");

  // set project specific environment
  std::ostringstream environment;
  environment << "VERBOSE=1|CMAKE_NO_VERBOSE=1|"; // verbose Makefile output
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC") {
    AddEnvVar(environment, "PATH", *lg);
    AddEnvVar(environment, "INCLUDE", *lg);
    AddEnvVar(environment, "LIB", *lg);
    AddEnvVar(environment, "LIBPATH", *lg);
  } else if (compilerId == "Intel") {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(environment, "INTEL_LICENSE_FILE", *lg);
  }
  AppendDictionary(xml, "org.eclipse.cdt.make.core.environment",
                   environment.str());

  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableFullBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.auto", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableAutoBuild", "false");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.clean",
                   "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.fullBuildTarget", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildArguments", "");
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.build.location",
    cmExtraEclipseCDT4Generator::GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.autoBuildTarget", "all");

  // set error parsers
  std::ostringstream errorOutputParser;

  if (compilerId == "MSVC") {
    errorOutputParser << "org.eclipse.cdt.core.VCErrorParser;";
  } else if (compilerId == "Intel") {
    errorOutputParser << "org.eclipse.cdt.core.ICCErrorParser;";
  }

  if (this->SupportsGmakeErrorParser) {
    errorOutputParser << "org.eclipse.cdt.core.GmakeErrorParser;";
  } else {
    errorOutputParser << "org.eclipse.cdt.core.MakeErrorParser;";
  }

  errorOutputParser << "org.eclipse.cdt.core.GCCErrorParser;"
                       "org.eclipse.cdt.core.GASErrorParser;"
                       "org.eclipse.cdt.core.GLDErrorParser;";
  AppendDictionary(xml, "org.eclipse.cdt.core.errorOutputParser",
                   errorOutputParser.str());

  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.ScannerConfigBuilder");
  xml.StartElement("arguments");
  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.EndElement(); // buildSpec

  // set natures for c/c++ projects
  xml.StartElement("natures");
  xml.Element("nature", "org.eclipse.cdt.make.core.makeNature");
  xml.Element("nature", "org.eclipse.cdt.make.core.ScannerConfigNature");

  for (std::string const& n : this->Natures) {
    xml.Element("nature", n);
  }

  if (cmValue extraNaturesProp =
        mf->GetState()->GetGlobalProperty("ECLIPSE_EXTRA_NATURES")) {
    std::vector<std::string> extraNatures = cmExpandedList(*extraNaturesProp);
    for (std::string const& n : extraNatures) {
      xml.Element("nature", n);
    }
  }

  xml.EndElement(); // natures

  xml.StartElement("linkedResources");
  // create linked resources
  if (this->IsOutOfSourceBuild) {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // https://gitlab.kitware.com/cmake/cmake/-/issues/9978 and because I found
    // it actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory =
      cmExtraEclipseCDT4Generator::GetEclipsePath(
        lg->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                       linkSourceDirectory)) {
      cmExtraEclipseCDT4Generator::AppendLinkedResource(
        xml, sourceLinkedResourceName,
        cmExtraEclipseCDT4Generator::GetEclipsePath(linkSourceDirectory),
        LinkToFolder);
      this->SrcLinkedResources.push_back(std::move(sourceLinkedResourceName));
    }
  }

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeOutputDirectory);

    this->CreateLinksForTargets(xml);
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
}